

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_send_close(Curl_easy *data)

{
  CURLcode CVar1;
  undefined1 local_21;
  undefined2 local_20;
  smb_close msg;
  smb_request *req;
  Curl_easy *data_local;
  
  msg._1_8_ = (data->req).p;
  memset(&local_21,0,9);
  local_21 = 3;
  local_20 = *(undefined2 *)(msg._1_8_ + 0x12);
  CVar1 = smb_send_message(data,'\x04',&local_21,9);
  return CVar1;
}

Assistant:

static CURLcode smb_send_close(struct Curl_easy *data)
{
  struct smb_request *req = data->req.p.smb;
  struct smb_close msg;

  memset(&msg, 0, sizeof(msg));
  msg.word_count = SMB_WC_CLOSE;
  msg.fid = smb_swap16(req->fid);

  return smb_send_message(data, SMB_COM_CLOSE, &msg, sizeof(msg));
}